

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nonogram.cpp
# Opt level: O3

Known * __thiscall Nonogram::get_vertical(Known *__return_storage_ptr__,Nonogram *this,uint x)

{
  Known local_a0;
  pair<std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>,_std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>_>
  local_50;
  
  std::
  pair<std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>,_std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>_>
  ::
  pair<std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>,_std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>,_true>
            (&local_50,&this->m_set,&this->m_value);
  get_board_vertical(&local_a0,this,x,&local_50);
  (__return_storage_ptr__->first).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage =
       local_a0.first.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_end_of_storage;
  (__return_storage_ptr__->first).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
       local_a0.first.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p;
  *(ulong *)&(__return_storage_ptr__->first).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset =
       CONCAT44(local_a0.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_,
                local_a0.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset);
  (__return_storage_ptr__->first).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
       local_a0.first.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p;
  *(ulong *)&(__return_storage_ptr__->first).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset =
       CONCAT44(local_a0.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_,
                local_a0.first.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
  local_a0.first.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_a0.first.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  local_a0.first.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_a0.first.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  local_a0.first.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (__return_storage_ptr__->second).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage =
       local_a0.second.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_end_of_storage;
  (__return_storage_ptr__->second).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
       local_a0.second.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p;
  *(ulong *)&(__return_storage_ptr__->second).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset =
       CONCAT44(local_a0.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_,
                local_a0.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset);
  (__return_storage_ptr__->second).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
       local_a0.second.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p;
  *(ulong *)&(__return_storage_ptr__->second).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset =
       CONCAT44(local_a0.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_,
                local_a0.second.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
  local_a0.second.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_a0.second.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  local_a0.second.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_a0.second.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  local_a0.second.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector(&local_50.second);
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector(&local_50.first);
  return __return_storage_ptr__;
}

Assistant:

Known Nonogram::get_vertical(unsigned int x) const {
    return move(get_board_vertical(x, {m_set, m_value}));
}